

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_process.c
# Opt level: O2

void end_query(ares_channel_t *channel,ares_server_t *server,ares_query_t *query,
              ares_status_t status,ares_dns_record_t *dnsrec)

{
  if (server != (ares_server_t *)0x0) {
    server->probe_pending = ARES_FALSE;
  }
  ares_metrics_record(query,server,status,dnsrec);
  (*query->callback)(query->arg,status,query->timeouts,dnsrec);
  ares_free_query(query);
  ares_queue_notify_empty(channel);
  return;
}

Assistant:

static void end_query(ares_channel_t *channel, ares_server_t *server,
                      ares_query_t *query, ares_status_t status,
                      const ares_dns_record_t *dnsrec)
{
  /* If we were probing for the server to come back online, lets mark it as
   * no longer being probed */
  if (server != NULL) {
    server->probe_pending = ARES_FALSE;
  }

  ares_metrics_record(query, server, status, dnsrec);

  /* Invoke the callback. */
  query->callback(query->arg, status, query->timeouts, dnsrec);
  ares_free_query(query);

  /* Check and notify if no other queries are enqueued on the channel.  This
   * must come after the callback and freeing the query for 2 reasons.
   *  1) The callback itself may enqueue a new query
   *  2) Technically the current query isn't detached until it is free()'d.
   */
  ares_queue_notify_empty(channel);
}